

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smc.cpp
# Opt level: O0

void __thiscall SMC::fragdis(SMC *this,string *fname,int label)

{
  byte bVar1;
  char *pcVar2;
  size_type sVar3;
  double dVar4;
  int local_284;
  undefined1 local_280 [4];
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  token;
  string local_260 [8];
  string line;
  int local_230;
  int local_22c;
  int FraglenCount;
  int Countset;
  ifstream input;
  int label_local;
  string *fname_local;
  SMC *this_local;
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(&FraglenCount,pcVar2,_S_in);
  local_22c = 0;
  local_230 = -1;
  while (bVar1 = std::ios::eof(), ((bVar1 ^ 0xff) & 1) != 0) {
    std::__cxx11::string::string(local_260);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&FraglenCount,local_260);
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_260);
    if (*pcVar2 == '#') {
      token.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_280);
      split((string *)local_260,' ',
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_280);
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_280);
      if (sVar3 == 4) {
        local_230 = local_230 + 1;
        local_22c = 0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_280,0);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        dVar4 = atof(pcVar2);
        this->minDistcon[label][local_230] = dVar4;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_280,1);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        dVar4 = atof(pcVar2);
        this->DistconBy[label][local_230] = dVar4;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_280,2);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        dVar4 = atof(pcVar2);
        this->minDistdel[label][local_230] = dVar4;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_280,3);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        dVar4 = atof(pcVar2);
        this->DistdelBy[label][local_230] = dVar4;
      }
      else {
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_280);
        if (sVar3 == 0x20) {
          for (local_284 = 0; local_284 < 0x20; local_284 = local_284 + 1) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_280,(long)local_284);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            dVar4 = atof(pcVar2);
            this->etedCon[label][local_230][local_22c][local_284] = dVar4;
          }
          local_22c = local_22c + 1;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_280);
      token.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    }
    std::__cxx11::string::~string(local_260);
  }
  std::ifstream::~ifstream(&FraglenCount);
  return;
}

Assistant:

void SMC::fragdis(string fname, int label) {
    // Populate etedP collection of distance lengths
    // Conditional distribution
    ifstream input(fname.c_str());
    int Countset = 0, FraglenCount = -1;
    while (!input.eof()) {
        // Read line
        string line;
        getline(input, line);
        if (line[0] == '#') continue;
        // Tokenize by tabs
        vector<string> token;
        split(line, ' ', token);
        if (token.size() == 4) {
            FraglenCount++;
            Countset = 0;
            minDistcon[label][FraglenCount] = atof(token[0].c_str());
            DistconBy[label][FraglenCount] = atof(token[1].c_str());
            minDistdel[label][FraglenCount] = atof(token[2].c_str());
            DistdelBy[label][FraglenCount] = atof(token[3].c_str());
        }
        else if (token.size() == 32) {
            for (int i = 0; i < 32; i++) {
                etedCon[label][FraglenCount][Countset][i] = atof(token[i].c_str());
            }
            Countset++;
        }
    }
}